

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nonlinearsolver.c
# Opt level: O1

SUNNonlinearSolver SUNNonlinSolNewEmpty(SUNContext sunctx)

{
  SUNNonlinearSolver __ptr;
  SUNNonlinearSolver_Ops p_Var1;
  
  if ((sunctx != (SUNContext)0x0) &&
     (__ptr = (SUNNonlinearSolver)malloc(0x18), __ptr != (SUNNonlinearSolver)0x0)) {
    p_Var1 = (SUNNonlinearSolver_Ops)malloc(0x68);
    if (p_Var1 != (SUNNonlinearSolver_Ops)0x0) {
      p_Var1->getnumiters = (_func_int_SUNNonlinearSolver_long_ptr *)0x0;
      p_Var1->getcuriter = (_func_int_SUNNonlinearSolver_int_ptr *)0x0;
      p_Var1->setctestfn = (_func_int_SUNNonlinearSolver_SUNNonlinSolConvTestFn_void_ptr *)0x0;
      p_Var1->setmaxiters = (_func_int_SUNNonlinearSolver_int *)0x0;
      p_Var1->setlsetupfn = (_func_int_SUNNonlinearSolver_SUNNonlinSolLSetupFn *)0x0;
      p_Var1->setlsolvefn = (_func_int_SUNNonlinearSolver_SUNNonlinSolLSolveFn *)0x0;
      p_Var1->free = (_func_int_SUNNonlinearSolver *)0x0;
      p_Var1->setsysfn = (_func_int_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0;
      p_Var1->setup = (_func_int_SUNNonlinearSolver_N_Vector_void_ptr *)0x0;
      p_Var1->solve =
           (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_realtype_int_void_ptr *)0x0;
      p_Var1->gettype = (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0;
      p_Var1->initialize = (_func_int_SUNNonlinearSolver *)0x0;
      p_Var1->getnumconvfails = (_func_int_SUNNonlinearSolver_long_ptr *)0x0;
      __ptr->sunctx = sunctx;
      __ptr->ops = p_Var1;
      __ptr->content = (void *)0x0;
      return __ptr;
    }
    free(__ptr);
  }
  return (SUNNonlinearSolver)0x0;
}

Assistant:

SUNNonlinearSolver SUNNonlinSolNewEmpty(SUNContext sunctx)
{
  SUNNonlinearSolver     NLS;
  SUNNonlinearSolver_Ops ops;

  /* check input */
  if (!sunctx) return(NULL);

  /* create nonlinear solver object */
  NLS = NULL;
  NLS = (SUNNonlinearSolver) malloc(sizeof *NLS);
  if (NLS == NULL) return(NULL);

  /* create nonlinear solver ops structure */
  ops = NULL;
  ops = (SUNNonlinearSolver_Ops) malloc(sizeof *ops);
  if (ops == NULL) { free(NLS); return(NULL); }

  /* initialize operations to NULL */
  ops->gettype         = NULL;
  ops->initialize      = NULL;
  ops->setup           = NULL;
  ops->solve           = NULL;
  ops->free            = NULL;
  ops->setsysfn        = NULL;
  ops->setlsetupfn     = NULL;
  ops->setlsolvefn     = NULL;
  ops->setctestfn      = NULL;
  ops->setmaxiters     = NULL;
  ops->getnumiters     = NULL;
  ops->getcuriter      = NULL;
  ops->getnumconvfails = NULL;

  /* attach context and ops, initialize content to NULL */
  NLS->sunctx  = sunctx;
  NLS->ops     = ops;
  NLS->content = NULL;

  return(NLS);
}